

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

TPZManVector<TPZEqnArray<long_double>,_10> * __thiscall
TPZManVector<TPZEqnArray<long_double>,_10>::operator=
          (TPZManVector<TPZEqnArray<long_double>,_10> *this,
          TPZManVector<TPZEqnArray<long_double>,_10> *copy)

{
  long lVar1;
  undefined1 auVar2 [16];
  TPZEqnArray<long_double> *pTVar3;
  ulong uVar4;
  void *pvVar5;
  TPZEqnArray<long_double> *pTVar6;
  TPZEqnArray<long_double> *pTVar7;
  TPZVec<TPZEqnArray<long_double>_> *in_RSI;
  TPZVec<TPZEqnArray<long_double>_> *in_RDI;
  ulong uVar8;
  int64_t i;
  int64_t nel;
  TPZEqnArray<long_double> *in_stack_ffffffffffffff28;
  TPZEqnArray<long_double> *in_stack_ffffffffffffff30;
  TPZEqnArray<long_double> *local_b0;
  TPZEqnArray<long_double> *pTVar9;
  long local_30;
  
  if (in_RDI != in_RSI) {
    pTVar3 = (TPZEqnArray<long_double> *)TPZVec<TPZEqnArray<long_double>_>::NElements(in_RSI);
    if (((in_RDI->fNAlloc < (long)pTVar3) && (in_RDI->fStore != (TPZEqnArray<long_double> *)0x0)) &&
       (in_RDI->fStore != (TPZEqnArray<long_double> *)(in_RDI + 1))) {
      pTVar9 = in_RDI->fStore;
      if (pTVar9 != (TPZEqnArray<long_double> *)0x0) {
        lVar1 = *(long *)&pTVar9[-1].field_0x51d8;
        for (pTVar6 = pTVar9 + lVar1; pTVar9 != pTVar6; pTVar6 = pTVar6 + -1) {
          TPZEqnArray<long_double>::~TPZEqnArray(in_stack_ffffffffffffff30);
        }
        operator_delete__(&pTVar9[-1].fLastTerm,lVar1 * 0x51e0 + 0x10);
      }
      in_RDI->fStore = (TPZEqnArray<long_double> *)0x0;
      in_RDI->fNAlloc = 0;
    }
    if ((long)pTVar3 < 0xb) {
      if ((in_RDI->fStore != (TPZEqnArray<long_double> *)(in_RDI + 1)) &&
         (pTVar9 = in_RDI->fStore, pTVar9 != (TPZEqnArray<long_double> *)0x0)) {
        lVar1 = *(long *)&pTVar9[-1].field_0x51d8;
        for (pTVar6 = pTVar9 + lVar1; pTVar9 != pTVar6; pTVar6 = pTVar6 + -1) {
          TPZEqnArray<long_double>::~TPZEqnArray(in_stack_ffffffffffffff30);
        }
        operator_delete__(&pTVar9[-1].fLastTerm,lVar1 * 0x51e0 + 0x10);
      }
      in_RDI->fNAlloc = 0;
      in_RDI->fStore = (TPZEqnArray<long_double> *)(in_RDI + 1);
      in_RDI->fNElements = (int64_t)pTVar3;
    }
    else if (in_RDI->fNAlloc < (long)pTVar3) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = pTVar3;
      uVar4 = SUB168(auVar2 * ZEXT816(0x51e0),0);
      uVar8 = uVar4 + 0x10;
      if (SUB168(auVar2 * ZEXT816(0x51e0),8) != 0 || 0xffffffffffffffef < uVar4) {
        uVar8 = 0xffffffffffffffff;
      }
      pTVar9 = pTVar3;
      pvVar5 = operator_new__(uVar8);
      *(TPZEqnArray<long_double> **)((long)pvVar5 + 8) = pTVar9;
      pTVar6 = (TPZEqnArray<long_double> *)((long)pvVar5 + 0x10);
      if (pTVar9 != (TPZEqnArray<long_double> *)0x0) {
        pTVar7 = pTVar6 + (long)pTVar9;
        local_b0 = pTVar6;
        do {
          TPZEqnArray<long_double>::TPZEqnArray(pTVar9);
          local_b0 = local_b0 + 1;
        } while (local_b0 != pTVar7);
      }
      in_RDI->fStore = pTVar6;
      in_RDI->fNAlloc = (int64_t)pTVar3;
      in_RDI->fNElements = (int64_t)pTVar3;
    }
    else {
      in_RDI->fNElements = (int64_t)pTVar3;
    }
    for (local_30 = 0; local_30 < (long)pTVar3; local_30 = local_30 + 1) {
      TPZEqnArray<long_double>::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
  }
  return (TPZManVector<TPZEqnArray<long_double>,_10> *)in_RDI;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}